

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * BinarySource_get_mp_ssh2(BinarySource *src)

{
  char cVar1;
  uchar *p;
  mp_int *pmVar2;
  size_t sVar3;
  ptrlen bytes;
  
  bytes = BinarySource_get_string(src->binarysource_);
  sVar3 = bytes.len;
  if (src->binarysource_->err == BSE_NO_ERROR) {
    if ((sVar3 == 0) ||
       ((cVar1 = *bytes.ptr, -1 < cVar1 &&
        ((cVar1 != '\0' || ((sVar3 != 1 && (*(char *)((long)bytes.ptr + 1) < '\0')))))))) {
      pmVar2 = mp_from_bytes_int(bytes,0xffffffffffffffff,sVar3 - 1);
      return pmVar2;
    }
    src->err = BSE_INVALID;
  }
  pmVar2 = mp_from_integer(0);
  return pmVar2;
}

Assistant:

mp_int *BinarySource_get_mp_ssh2(BinarySource *src)
{
    ptrlen bytes = get_string(src);
    if (get_err(src)) {
        return mp_from_integer(0);
    } else {
        const unsigned char *p = bytes.ptr;
        if ((bytes.len > 0 &&
             ((p[0] & 0x80) ||
              (p[0] == 0 && (bytes.len <= 1 || !(p[1] & 0x80)))))) {
            src->err = BSE_INVALID;
            return mp_from_integer(0);
        }
        return mp_from_bytes_be(bytes);
    }
}